

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_98(QPDF *pdf,char *arg2)

{
  __type_conflict1 _Var1;
  bool bVar2;
  int iVar3;
  allocator<char> local_1b9;
  string local_1b8 [32];
  QPDFObjectHandle local_198;
  JSON local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140 [32];
  QPDFObjectHandle local_120;
  QPDFObjectHandle local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  JSON local_c0;
  Pl_Buffer local_b0 [8];
  Pl_Buffer bf2;
  Pl_Buffer local_68 [8];
  Pl_Buffer bf1;
  undefined1 local_30 [8];
  QPDFObjectHandle oh;
  int i;
  char *arg2_local;
  QPDF *pdf_local;
  
  oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 1;
  while( true ) {
    iVar3 = (int)pdf;
    if (6 < oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_) {
      QPDF::getObject((int)&local_120,iVar3);
      QPDFObjectHandle::getDict();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_140,"/Test",&local_141);
      operator____qpdf((char *)&local_158,0x1734c9);
      QPDFObjectHandle::replaceKey((string *)&local_110,(QPDFObjectHandle *)local_140);
      QPDFObjectHandle::~QPDFObjectHandle(&local_158);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      QPDFObjectHandle::~QPDFObjectHandle(&local_110);
      QPDFObjectHandle::~QPDFObjectHandle(&local_120);
      QPDF::getObject((int)&local_198,iVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b8,"",&local_1b9);
      QPDFObjectHandle::getStreamJSON
                ((int)&local_188,(qpdf_json_stream_data_e)&local_198,qpdf_dl_specialized,
                 (Pipeline *)0x1,(string *)0x1);
      JSON::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_178,
                              "{\n  \"data\": \"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\",\n  \"dict\": {\n    \"/Test\": 42\n  }\n}"
                             );
      if (!bVar2) {
        __assert_fail("pdf.getObject(4, 0) .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, \"\") .unparse() == \"{\\n\" \"  \\\"data\\\": \\\"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\\\",\\n\" \"  \\\"dict\\\": {\\n\" \"    \\\"/Test\\\": 42\\n\" \"  }\\n\" \"}\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0xd90,"void test_98(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_178);
      JSON::~JSON(&local_188);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      QPDFObjectHandle::~QPDFObjectHandle(&local_198);
      return;
    }
    QPDF::getObject((int)local_30,iVar3);
    Pl_Buffer::Pl_Buffer(local_68,"write",(Pipeline *)0x0);
    Pl_Buffer::Pl_Buffer(local_b0,"get",(Pipeline *)0x0);
    QPDFObjectHandle::writeJSON((int)local_30,(Pipeline *)0x2,SUB81(local_68,0),1);
    Pl_Buffer::finish();
    QPDFObjectHandle::getJSON((int)&local_c0,SUB81(local_30,0));
    JSON::write((Pipeline *)&local_c0,(ulong)local_b0);
    JSON::~JSON(&local_c0);
    Pl_Buffer::finish();
    Pl_Buffer::getString_abi_cxx11_();
    Pl_Buffer::getString_abi_cxx11_();
    _Var1 = std::operator==(&local_e0,&local_100);
    if (!_Var1) break;
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    Pl_Buffer::~Pl_Buffer(local_b0);
    Pl_Buffer::~Pl_Buffer(local_68);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
    oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._4_4_ + 1;
  }
  __assert_fail("bf1.getString() == bf2.getString()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd82,"void test_98(QPDF &, const char *)");
}

Assistant:

static void
test_98(QPDF& pdf, char const* arg2)
{
    // Test methods no longer used by qpdf as a result of QPDFObjectHandle::writeJSON. This test is
    // built for minimal.pdf.

    // Test QPDFObjectHandle::getJSON.
    for (int i = 1; i < 7; ++i) {
        auto oh = pdf.getObject(i, 0);
        Pl_Buffer bf1{"write", nullptr};
        Pl_Buffer bf2{"get", nullptr};
        oh.writeJSON(JSON::LATEST, &bf1, true, 7);
        bf1.finish();
        oh.getJSON(JSON::LATEST, true).write(&bf2, 7);
        bf2.finish();
        assert(bf1.getString() == bf2.getString());
    }

    // Test QPDFObjectHandle::getStreamJSON.
    pdf.getObject(4, 0).getDict().replaceKey("/Test", "42"_qpdf);
    assert(
        pdf.getObject(4, 0)
            .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, "")
            .unparse() ==
        "{\n"
        "  \"data\": \"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\",\n"
        "  \"dict\": {\n"
        "    \"/Test\": 42\n"
        "  }\n"
        "}");
}